

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

reference __thiscall
QVLABase<QString>::emplace_back_impl<QString>
          (QVLABase<QString> *this,qsizetype prealloc,void *array,QString *args)

{
  QString *pQVar1;
  QString *pQVar2;
  qsizetype in_RCX;
  void *in_RDX;
  qsizetype in_RSI;
  QVLABaseBase *in_RDI;
  reference r;
  QVLABaseBase *this_00;
  
  this_00 = in_RDI;
  pQVar1 = (QString *)QVLABaseBase::size(in_RDI);
  pQVar2 = (QString *)QVLABaseBase::capacity(in_RDI);
  if (pQVar1 == pQVar2) {
    growBy((QVLABase<QString> *)this_00,in_RSI,in_RDX,in_RCX);
  }
  end((QVLABase<QString> *)pQVar1);
  pQVar1 = q20::construct_at<QString,QString,void>(pQVar1,(QString *)in_RDI);
  in_RDI->s = in_RDI->s + 1;
  return pQVar1;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }